

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolver.cpp
# Opt level: O3

shared_ptr<miniros::master::HostInfo> __thiscall
miniros::master::AddressResolver::updateHost(AddressResolver *this,RequesterInfo *requesterInfo)

{
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<miniros::master::HostInfo>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::shared_ptr<miniros::master::HostInfo>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<miniros::master::HostInfo>>>>
  *this_00;
  long lVar1;
  _Base_ptr p_Var2;
  bool bVar3;
  Type TVar4;
  int iVar5;
  iterator iVar6;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  pointer pcVar7;
  pthread_mutex_t *__mutex;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<miniros::master::HostInfo>_>_>,_bool>
  pVar8;
  shared_ptr<miniros::master::HostInfo> sVar9;
  URL url;
  undefined1 local_e1;
  pthread_mutex_t *local_e0;
  key_type local_d8;
  URL local_b8;
  
  lVar1._0_4_ = in_RDX._M_pi[2]._M_use_count;
  lVar1._4_4_ = in_RDX._M_pi[2]._M_weak_count;
  if (lVar1 == 0) {
    (this->m_hostname)._M_dataplus._M_p = (pointer)0x0;
    (this->m_hostname)._M_string_length = 0;
    goto LAB_0023f538;
  }
  network::URL::URL(&local_b8);
  network::URL::fromString(&local_b8,(string *)(in_RDX._M_pi + 2),false);
  TVar4 = network::NetAddress::checkAddressType(&local_b8.host);
  bVar3 = network::NetAddress::isLocal((NetAddress *)(in_RDX._M_pi + 4));
  __mutex = (pthread_mutex_t *)&(requesterInfo->clientAddress).rawAddress;
  iVar5 = pthread_mutex_lock(__mutex);
  if (iVar5 != 0) {
    ::std::__throw_system_error(iVar5);
  }
  if (TVar4 == AddressInvalid) {
    this_00 = (_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<miniros::master::HostInfo>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::shared_ptr<miniros::master::HostInfo>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<miniros::master::HostInfo>>>>
               *)((requesterInfo->callerApi).field_2._M_local_buf + 8);
    local_e0 = __mutex;
    iVar6 = ::std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<miniros::master::HostInfo>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<miniros::master::HostInfo>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<miniros::master::HostInfo>_>_>_>
            ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<miniros::master::HostInfo>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<miniros::master::HostInfo>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<miniros::master::HostInfo>_>_>_>
                    *)this_00,&local_b8.host);
    if ((NetAddress *)iVar6._M_node == &requesterInfo->clientAddress) {
      local_d8._M_dataplus._M_p = (pointer)0x0;
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<miniros::master::HostInfo,std::allocator<miniros::master::HostInfo>,std::__cxx11::string&>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_d8._M_string_length,
                 (HostInfo **)&local_d8,(allocator<miniros::master::HostInfo> *)&local_e1,
                 &local_b8.host);
      pVar8 = ::std::
              _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<miniros::master::HostInfo>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::shared_ptr<miniros::master::HostInfo>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<miniros::master::HostInfo>>>>
              ::_M_emplace_unique<std::__cxx11::string&,std::shared_ptr<miniros::master::HostInfo>>
                        (this_00,&local_b8.host,(shared_ptr<miniros::master::HostInfo> *)&local_d8);
      iVar6._M_node = (_Base_ptr)pVar8.first._M_node;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._M_string_length !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._M_string_length);
      }
    }
    pcVar7 = *(pointer *)(iVar6._M_node + 2);
    if (bVar3) {
      pcVar7[0x50] = '\x01';
    }
    else {
      ::std::
      _Rb_tree<miniros::network::NetAddress,miniros::network::NetAddress,std::_Identity<miniros::network::NetAddress>,miniros::network::AddressCompare,std::allocator<miniros::network::NetAddress>>
      ::_M_insert_unique<miniros::network::NetAddress_const&>
                ((_Rb_tree<miniros::network::NetAddress,miniros::network::NetAddress,std::_Identity<miniros::network::NetAddress>,miniros::network::AddressCompare,std::allocator<miniros::network::NetAddress>>
                  *)(pcVar7 + 0x20),(NetAddress *)(in_RDX._M_pi + 4));
      pcVar7 = *(pointer *)(iVar6._M_node + 2);
    }
    (this->m_hostname)._M_dataplus._M_p = pcVar7;
    p_Var2 = iVar6._M_node[2]._M_parent;
    (this->m_hostname)._M_string_length = (size_type)p_Var2;
    __mutex = local_e0;
joined_r0x0023f4a1:
    if (p_Var2 != (_Base_ptr)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)&p_Var2->_M_parent = *(int *)&p_Var2->_M_parent + 1;
        UNLOCK();
      }
      else {
        *(int *)&p_Var2->_M_parent = *(int *)&p_Var2->_M_parent + 1;
      }
    }
  }
  else {
    if (bVar3) {
      local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"localhost","");
      iVar6 = ::std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<miniros::master::HostInfo>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<miniros::master::HostInfo>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<miniros::master::HostInfo>_>_>_>
              ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<miniros::master::HostInfo>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<miniros::master::HostInfo>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<miniros::master::HostInfo>_>_>_>
                      *)((long)&(requesterInfo->callerApi).field_2 + 8),&local_d8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
        operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
      }
      if ((NetAddress *)iVar6._M_node != &requesterInfo->clientAddress) {
        (this->m_hostname)._M_dataplus._M_p = *(pointer *)(iVar6._M_node + 2);
        p_Var2 = iVar6._M_node[2]._M_parent;
        (this->m_hostname)._M_string_length = (size_type)p_Var2;
        goto joined_r0x0023f4a1;
      }
    }
    (this->m_hostname)._M_dataplus._M_p = (pointer)0x0;
    (this->m_hostname)._M_string_length = 0;
  }
  pthread_mutex_unlock(__mutex);
  in_RDX._M_pi = extraout_RDX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8.query._M_dataplus._M_p != &local_b8.query.field_2) {
    operator_delete(local_b8.query._M_dataplus._M_p,local_b8.query.field_2._M_allocated_capacity + 1
                   );
    in_RDX._M_pi = extraout_RDX_00;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8.path._M_dataplus._M_p != &local_b8.path.field_2) {
    operator_delete(local_b8.path._M_dataplus._M_p,local_b8.path.field_2._M_allocated_capacity + 1);
    in_RDX._M_pi = extraout_RDX_01;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8.scheme._M_dataplus._M_p != &local_b8.scheme.field_2) {
    operator_delete(local_b8.scheme._M_dataplus._M_p,
                    local_b8.scheme.field_2._M_allocated_capacity + 1);
    in_RDX._M_pi = extraout_RDX_02;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8.host._M_dataplus._M_p != &local_b8.host.field_2) {
    operator_delete(local_b8.host._M_dataplus._M_p,local_b8.host.field_2._M_allocated_capacity + 1);
    in_RDX._M_pi = extraout_RDX_03;
  }
LAB_0023f538:
  sVar9.super___shared_ptr<miniros::master::HostInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = in_RDX._M_pi;
  sVar9.super___shared_ptr<miniros::master::HostInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<miniros::master::HostInfo>)
         sVar9.super___shared_ptr<miniros::master::HostInfo,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<HostInfo> AddressResolver::updateHost(const  RequesterInfo& requesterInfo)
{
  if (requesterInfo.callerApi.empty())
    return {};

  network::URL url;
  url.fromString(requesterInfo.callerApi, /*defaultPort*/false);

  // Host can contain either hostname or direct IP address.
  // We should try to make sure that m_hosts[host] points to the same object for both hostname and IP.

  // check if we got a direct IP address instead of a string hostname.
  bool isIP = network::NetAddress::checkAddressType(url.host) != network::NetAddress::AddressInvalid;
  bool isSameMachine = requesterInfo.clientAddress.isLocal();

  std::scoped_lock lock(m_mutex);

  if (isIP) {
    if (isSameMachine) {
      auto it = m_hosts.find("localhost");
      if (it != m_hosts.end())
        return it->second;
    }
    // TODO: find host which corresponds to client IP.
    return {};
  }

  auto it = m_hosts.find(url.host);
  if (it == m_hosts.end()) {
    // Avahi or similar DNS services can provide an alias for some host. Suppose we have some host="rpi.robot". Avahi
    // will provide DNS for "rpi.robot.local" hostname. Some users can force usage of Avahi hostname by specifying
    // ROS_HOSTNAME=rpi.robot.local. We should make sure this alias is points to the same HostInfo object.

    // In the same time, we should be ready that some hosts can have their DHCP ip addresses reassigned.
    // TODO: Check if this IP is already used.
    it = m_hosts.emplace(url.host, std::make_shared<HostInfo>(url.host)).first;
  }

  if (!isSameMachine)
    it->second->addresses.insert((requesterInfo.clientAddress));
  else
    it->second->local = true;

  return it->second;
}